

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::RegisterStorageClassConsumer
          (ValidationState_t *this,StorageClass storage_class,Instruction *consumer)

{
  bool bVar1;
  uint32_t uVar2;
  spv_const_context psVar3;
  Function *pFVar4;
  anon_class_1_0_00000001 local_369;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_368;
  anon_class_1_0_00000001 local_341;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_340;
  anon_class_32_1_293d74c2 local_320;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_300;
  undefined1 local_2e0 [8];
  string errorVUID_7;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_2a0;
  undefined1 local_280 [8];
  string errorVUID_6;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_240;
  undefined1 local_220 [8];
  string errorVUID_5;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_1e0;
  undefined1 local_1c0 [8];
  string errorVUID_4;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_180;
  undefined1 local_160 [8];
  string errorVUID_3;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_120;
  undefined1 local_100 [8];
  string errorVUID_2;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_c0;
  undefined1 local_a0 [8];
  string errorVUID_1;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_60;
  undefined1 local_40 [8];
  string errorVUID;
  Instruction *consumer_local;
  StorageClass storage_class_local;
  ValidationState_t *this_local;
  
  errorVUID.field_2._8_8_ = consumer;
  psVar3 = context(this);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  if (bVar1) {
    if (storage_class == Output) {
      VkErrorID_abi_cxx11_((string *)local_40,this,0x1224,(char *)0x0);
      pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
      uVar2 = Function::id(pFVar4);
      pFVar4 = function(this,uVar2);
      std::__cxx11::string::string
                ((string *)(errorVUID_1.field_2._M_local_buf + 8),(string *)local_40);
      std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
      function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__0,void>
                ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_60,
                 (anon_class_32_1_293d74c2 *)((long)&errorVUID_1.field_2 + 8));
      Function::RegisterExecutionModelLimitation(pFVar4,&local_60);
      std::
      function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
      ::~function(&local_60);
      RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_0::~__0
                ((__0 *)(errorVUID_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_40);
    }
    if (storage_class == Workgroup) {
      VkErrorID_abi_cxx11_((string *)local_a0,this,0x1225,(char *)0x0);
      pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
      uVar2 = Function::id(pFVar4);
      pFVar4 = function(this,uVar2);
      std::__cxx11::string::string
                ((string *)(errorVUID_2.field_2._M_local_buf + 8),(string *)local_a0);
      std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
      function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__1,void>
                ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_c0,
                 (anon_class_32_1_293d74c2 *)((long)&errorVUID_2.field_2 + 8));
      Function::RegisterExecutionModelLimitation(pFVar4,&local_c0);
      std::
      function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
      ::~function(&local_c0);
      RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_1::~__1
                ((__1 *)(errorVUID_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  if (storage_class == CallableDataKHR) {
    VkErrorID_abi_cxx11_((string *)local_100,this,0x1260,(char *)0x0);
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::__cxx11::string::string
              ((string *)(errorVUID_3.field_2._M_local_buf + 8),(string *)local_100);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__2,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_120,
               (anon_class_32_1_293d74c2 *)((long)&errorVUID_3.field_2 + 8));
    Function::RegisterExecutionModelLimitation(pFVar4,&local_120);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_120);
    RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_2::~__2
              ((__2 *)(errorVUID_3.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_100);
  }
  else if (storage_class == IncomingCallableDataKHR) {
    VkErrorID_abi_cxx11_((string *)local_160,this,0x1261,(char *)0x0);
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::__cxx11::string::string
              ((string *)(errorVUID_4.field_2._M_local_buf + 8),(string *)local_160);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__3,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_180,
               (anon_class_32_1_293d74c2 *)((long)&errorVUID_4.field_2 + 8));
    Function::RegisterExecutionModelLimitation(pFVar4,&local_180);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_180);
    RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_3::~__3
              ((__3 *)(errorVUID_4.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_160);
  }
  else if (storage_class == RayPayloadKHR) {
    VkErrorID_abi_cxx11_((string *)local_1c0,this,0x125a,(char *)0x0);
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::__cxx11::string::string
              ((string *)(errorVUID_5.field_2._M_local_buf + 8),(string *)local_1c0);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__4,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_1e0,
               (anon_class_32_1_293d74c2 *)((long)&errorVUID_5.field_2 + 8));
    Function::RegisterExecutionModelLimitation(pFVar4,&local_1e0);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_1e0);
    RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_4::~__4
              ((__4 *)(errorVUID_5.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_1c0);
  }
  else if (storage_class == HitAttributeKHR) {
    VkErrorID_abi_cxx11_((string *)local_220,this,0x125d,(char *)0x0);
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::__cxx11::string::string
              ((string *)(errorVUID_6.field_2._M_local_buf + 8),(string *)local_220);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__5,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_240,
               (anon_class_32_1_293d74c2 *)((long)&errorVUID_6.field_2 + 8));
    Function::RegisterExecutionModelLimitation(pFVar4,&local_240);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_240);
    RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_5::~__5
              ((__5 *)(errorVUID_6.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_220);
  }
  else if (storage_class == IncomingRayPayloadKHR) {
    VkErrorID_abi_cxx11_((string *)local_280,this,0x125b,(char *)0x0);
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::__cxx11::string::string
              ((string *)(errorVUID_7.field_2._M_local_buf + 8),(string *)local_280);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__6,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_2a0,
               (anon_class_32_1_293d74c2 *)((long)&errorVUID_7.field_2 + 8));
    Function::RegisterExecutionModelLimitation(pFVar4,&local_2a0);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_2a0);
    RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_6::~__6
              ((__6 *)(errorVUID_7.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_280);
  }
  else if (storage_class == ShaderRecordBufferKHR) {
    VkErrorID_abi_cxx11_((string *)local_2e0,this,0x1bcf,(char *)0x0);
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::__cxx11::string::string((string *)&local_320,(string *)local_2e0);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__7,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_300,&local_320);
    Function::RegisterExecutionModelLimitation(pFVar4,&local_300);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_300);
    RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::$_7::~__7
              ((__7 *)&local_320);
    std::__cxx11::string::~string((string *)local_2e0);
  }
  else if (storage_class == TaskPayloadWorkgroupEXT) {
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__8,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_340,&local_341);
    Function::RegisterExecutionModelLimitation(pFVar4,&local_340);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_340);
  }
  else if (storage_class == HitObjectAttributeNV) {
    pFVar4 = Instruction::function((Instruction *)errorVUID.field_2._8_8_);
    uVar2 = Function::id(pFVar4);
    pFVar4 = function(this,uVar2);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::ValidationState_t::RegisterStorageClassConsumer(spv::StorageClass,spvtools::val::Instruction*)::__9,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_368,&local_369);
    Function::RegisterExecutionModelLimitation(pFVar4,&local_368);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_368);
  }
  return;
}

Assistant:

void ValidationState_t::RegisterStorageClassConsumer(
    spv::StorageClass storage_class, Instruction* consumer) {
  if (spvIsVulkanEnv(context()->target_env)) {
    if (storage_class == spv::StorageClass::Output) {
      std::string errorVUID = VkErrorID(4644);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::GLCompute ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR ||
                model == spv::ExecutionModel::CallableKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Output Storage Class must not be "
                    "used in GLCompute, RayGenerationKHR, IntersectionKHR, "
                    "AnyHitKHR, ClosestHitKHR, MissKHR, or CallableKHR "
                    "execution models";
              }
              return false;
            }
            return true;
          });
    }

    if (storage_class == spv::StorageClass::Workgroup) {
      std::string errorVUID = VkErrorID(4645);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model != spv::ExecutionModel::GLCompute &&
                model != spv::ExecutionModel::TaskNV &&
                model != spv::ExecutionModel::MeshNV &&
                model != spv::ExecutionModel::TaskEXT &&
                model != spv::ExecutionModel::MeshEXT) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Workgroup Storage Class is limited "
                    "to MeshNV, TaskNV, and GLCompute execution model";
              }
              return false;
            }
            return true;
          });
    }
  }

  if (storage_class == spv::StorageClass::CallableDataKHR) {
    std::string errorVUID = VkErrorID(4704);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "CallableDataKHR Storage Class is limited to "
                      "RayGenerationKHR, ClosestHitKHR, CallableKHR, and "
                      "MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingCallableDataKHR) {
    std::string errorVUID = VkErrorID(4705);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::CallableKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingCallableDataKHR Storage Class is limited to "
                      "CallableKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::RayPayloadKHR) {
    std::string errorVUID = VkErrorID(4698);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([errorVUID](
                                               spv::ExecutionModel model,
                                               std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  errorVUID +
                  "RayPayloadKHR Storage Class is limited to RayGenerationKHR, "
                  "ClosestHitKHR, and MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  } else if (storage_class == spv::StorageClass::HitAttributeKHR) {
    std::string errorVUID = VkErrorID(4701);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR) {
                if (message) {
                  *message = errorVUID +
                             "HitAttributeKHR Storage Class is limited to "
                             "IntersectionKHR, AnyHitKHR, sand ClosestHitKHR "
                             "execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingRayPayloadKHR) {
    std::string errorVUID = VkErrorID(4699);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingRayPayloadKHR Storage Class is limited to "
                      "AnyHitKHR, ClosestHitKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::ShaderRecordBufferKHR) {
    std::string errorVUID = VkErrorID(7119);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "ShaderRecordBufferKHR Storage Class is limited to "
                      "RayGenerationKHR, IntersectionKHR, AnyHitKHR, "
                      "ClosestHitKHR, CallableKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::TaskPayloadWorkgroupEXT) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::TaskEXT &&
                  model != spv::ExecutionModel::MeshEXT) {
                if (message) {
                  *message =
                      "TaskPayloadWorkgroupEXT Storage Class is limited to "
                      "TaskEXT and MeshKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::HitObjectAttributeNV) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([](spv::ExecutionModel model,
                                              std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  "HitObjectAttributeNV Storage Class is limited to "
                  "RayGenerationKHR, ClosestHitKHR or MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  }
}